

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O1

mpt_metatype * mpt_iterator_poly(char *desc,mpt_array *base)

{
  mpt_buffer *pmVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  mpt_metatype *pmVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  size_t __n;
  undefined1 *puVar11;
  ulong *puVar12;
  bool bVar13;
  coeff_poly coeff [128];
  ulong auStack_848 [2];
  undefined1 local_838 [8];
  undefined1 local_830 [2048];
  
  puVar12 = auStack_848;
  pmVar1 = base->_buf;
  if ((pmVar1 == (mpt_buffer *)0x0) ||
     (lVar3 = (**(code **)(((_mpt_vptr_convertable *)&pmVar1->_vptr)->convert + 0x10))(pmVar1),
     lVar3 != 0)) {
    iVar8 = 0;
    if (desc == (char *)0x0) {
      lVar3 = 0;
      desc = (char *)0x0;
    }
    else {
      puVar11 = local_830;
      lVar3 = 0;
      do {
        uVar2 = mpt_cdouble(puVar11,desc,0);
        if ((int)uVar2 < 1) {
          iVar9 = 2;
          if (lVar3 == 0) {
            if (pmVar1 != (mpt_buffer *)0x0) {
              (**(code **)(((_mpt_vptr_convertable *)&pmVar1->_vptr)->convert + 8))(pmVar1);
            }
            piVar4 = __errno_location();
            *piVar4 = 0x16;
            iVar9 = 1;
          }
        }
        else {
          desc = desc + uVar2;
          iVar9 = 0;
        }
        if (iVar9 != 0) {
          if (iVar9 != 2) {
            return (mpt_metatype *)0x0;
          }
          goto LAB_00109be8;
        }
        lVar3 = lVar3 + 1;
        puVar11 = puVar11 + 0x10;
      } while (lVar3 != 0x80);
      lVar3 = 0x80;
    }
LAB_00109be8:
    iVar9 = (int)lVar3;
    if ((iVar9 != 0) && (pcVar5 = strchr(desc,0x3a), pcVar5 != (char *)0x0)) {
      uVar10 = (ulong)(iVar9 - 1);
      pcVar5 = pcVar5 + 1;
      iVar8 = 1;
      auStack_848[1] = uVar10;
      do {
        puVar12 = (ulong *)((long)puVar12 + 0x10);
        bVar13 = uVar10 == 0;
        uVar10 = uVar10 - 1;
        if (bVar13) {
          iVar8 = (int)auStack_848[1];
          goto LAB_00109c54;
        }
        uVar2 = mpt_cdouble(puVar12,pcVar5,0);
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        pcVar5 = pcVar5 + uVar7;
        iVar8 = iVar8 + -1;
      } while (0 < (int)uVar2);
      iVar8 = (uint)(0 < (int)uVar2) - iVar8;
    }
LAB_00109c54:
    if (iVar8 < iVar9) {
      lVar3 = (long)iVar9 - (long)iVar8;
      puVar12 = auStack_848 + (long)iVar8 * 2;
      do {
        puVar12 = puVar12 + 2;
        *puVar12 = 0;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    __n = (long)iVar9 * 0x10;
    pmVar6 = (mpt_metatype *)malloc(__n + 0x40);
    if (pmVar6 != (mpt_metatype *)0x0) {
      pmVar6->_vptr = &mpt_iterator_poly::polyMeta;
      pmVar6[1]._vptr = (_mpt_vptr_metatype *)&mpt_iterator_poly::polyIter;
      pmVar6[2]._vptr = (_mpt_vptr_metatype *)0x0;
      pmVar6[3]._vptr = (_mpt_vptr_metatype *)0x0;
      pmVar6[5]._vptr = (_mpt_vptr_metatype *)pmVar1;
      pmVar6[6]._vptr = (_mpt_vptr_metatype *)0x0;
      *(int *)&pmVar6[7]._vptr = iVar9;
      memcpy(pmVar6 + 8,local_838,__n);
      return pmVar6;
    }
    if (pmVar1 != (mpt_buffer *)0x0) {
      (**(code **)(((_mpt_vptr_convertable *)&pmVar1->_vptr)->convert + 8))(pmVar1);
    }
  }
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_poly(const char *desc, const _MPT_ARRAY_TYPE(double) *base)
{
	static const MPT_INTERFACE_VPTR(metatype) polyMeta = {
		{ iterPolyConv },
		iterPolyUnref,
		iterPolyRef,
		iterPolyClone
	};
	static const MPT_INTERFACE_VPTR(iterator) polyIter = {
		iterPolyValue,
		iterPolyAdvance,
		iterPolyReset
	};
	MPT_STRUCT(iteratorPolynom) *data;
	MPT_STRUCT(buffer) *buf;
	struct coeff_poly coeff[128];
	int nc = 0, ns = sizeof(coeff)/sizeof(*coeff);
	
	if ((buf = base->_buf)
	    && !buf->_vptr->addref(buf)) {
		return 0;
	}
	/* polynom coefficients */
	if (desc) {
		do {
			ssize_t len = mpt_cdouble(&coeff[nc].mult, desc, 0);
			
			if (len <= 0) {
				if (!nc) {
					if (buf) {
						buf->_vptr->unref(buf);
					}
					errno = EINVAL;
					return 0;
				}
				break;
			}
			desc += len;
		} while (++nc < ns);
	}
	/* variable shift */
	ns = 0;
	if (nc && (desc = strchr(desc, ':'))) {
		int max = nc - 1;
		++desc;
		while (ns < max) {
			ssize_t len = mpt_cdouble(&coeff[ns].shift, desc, 0);
			
			if (len <= 0) {
				break;
			}
			desc += len;
			++ns;
		}
	}
	for ( ; ns < nc; ++ns) {
		coeff[ns].shift = 0;
	}
	if (!(data = malloc(sizeof(*data) + nc * sizeof(*coeff)))) {
		if (buf) {
			buf->_vptr->unref(buf);
		}
		return 0;
	}
	data->_mt._vptr = &polyMeta;
	data->_it._vptr = &polyIter;
	
	MPT_value_set(&data->val, 0, 0);
	
	data->grid._buf = buf;
	data->pos = 0;
	data->coeff = nc;
	memcpy(data + 1, coeff, nc * sizeof(*coeff));
	
	return &data->_mt;
}